

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

ParamGenerator<solitaire::colliders::CardPositionData> __thiscall
testing::internal::ValueArray::operator_cast_to_ParamGenerator(ValueArray *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ParamGenerator<solitaire::colliders::CardPositionData> PVar1;
  _Vector_base<solitaire::colliders::CardPositionData,_std::allocator<solitaire::colliders::CardPositionData>_>
  _Stack_28;
  
  ValueArray<solitaire::colliders::CardPositionData,solitaire::colliders::CardPositionData,solitaire::colliders::CardPositionData,solitaire::colliders::CardPositionData,solitaire::colliders::CardPositionData,solitaire::colliders::CardPositionData,solitaire::colliders::CardPositionData,solitaire::colliders::CardPositionData>
  ::MakeVector<solitaire::colliders::CardPositionData,0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul>(&_Stack_28);
  ValuesIn<std::vector<solitaire::colliders::CardPositionData,std::allocator<solitaire::colliders::CardPositionData>>>
            ((testing *)this,
             (vector<solitaire::colliders::CardPositionData,_std::allocator<solitaire::colliders::CardPositionData>_>
              *)&_Stack_28);
  std::
  _Vector_base<solitaire::colliders::CardPositionData,_std::allocator<solitaire::colliders::CardPositionData>_>
  ::~_Vector_base(&_Stack_28);
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<solitaire::colliders::CardPositionData>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<solitaire::colliders::CardPositionData>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ParamGenerator<solitaire::colliders::CardPositionData>)
         PVar1.impl_.
         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<solitaire::colliders::CardPositionData>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

operator ParamGenerator<T>() const {  // NOLINT
    return ValuesIn(MakeVector<T>(MakeIndexSequence<sizeof...(Ts)>()));
  }